

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffghadll(fitsfile *fptr,LONGLONG *headstart,LONGLONG *datastart,LONGLONG *dataend,int *status)

{
  int iVar1;
  int *status_local;
  LONGLONG *dataend_local;
  LONGLONG *datastart_local;
  LONGLONG *headstart_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if ((fptr->Fptr->datastart == -1) && (iVar1 = ffrdef(fptr,status), 0 < iVar1)) {
        return *status;
      }
    }
    else {
      iVar1 = ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
      if (0 < iVar1) {
        return *status;
      }
    }
    if (headstart != (LONGLONG *)0x0) {
      *headstart = fptr->Fptr->headstart[fptr->Fptr->curhdu];
    }
    if (datastart != (LONGLONG *)0x0) {
      *datastart = fptr->Fptr->datastart;
    }
    if (dataend != (LONGLONG *)0x0) {
      *dataend = fptr->Fptr->headstart[fptr->Fptr->curhdu + 1];
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffghadll(fitsfile *fptr,     /* I - FITS file pointer                     */
            LONGLONG *headstart, /* O - byte offset to beginning of CHDU      */
            LONGLONG *datastart, /* O - byte offset to beginning of next HDU  */
            LONGLONG *dataend,   /* O - byte offset to beginning of next HDU  */
            int *status)         /* IO - error status     */
/*
  Return the address (= byte offset) in the FITS file to the beginning of
  the current HDU, the beginning of the data unit, and the end of the data unit.
*/
{
    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        if (ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status) > 0)
            return(*status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        if (ffrdef(fptr, status) > 0)           /* rescan header */
            return(*status);
    }

    if (headstart)
        *headstart = (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu];       

    if (datastart)
        *datastart = (fptr->Fptr)->datastart;

    if (dataend)
        *dataend = (fptr->Fptr)->headstart[((fptr->Fptr)->curhdu) + 1];       

    return(*status);
}